

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  int local_134;
  string local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  long local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) {
      UnitTest::GetInstance();
      iVar1 = chdir(((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                    _M_dataplus._M_p);
      if (iVar1 != 0) {
        paVar10 = &local_a0;
        local_b0 = paVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"chdir(\"","");
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
        paVar11 = &local_c0;
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar3;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar3 + 2);
        if (local_d0 == paVar8) {
          local_c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_c0._8_8_ = plVar3[3];
          local_d0 = paVar11;
        }
        else {
          local_c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_c8 = plVar3[1];
        *plVar3 = (long)paVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
        paVar8 = &local_40;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar4;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar4 + 2);
        if (local_50 == paVar9) {
          local_40._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_40._8_8_ = puVar4[3];
          local_50 = paVar8;
        }
        else {
          local_40._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_48 = puVar4[1];
        *puVar4 = paVar9;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        uVar7 = 0xf;
        if (local_50 != paVar8) {
          uVar7 = local_40._M_allocated_capacity;
        }
        paVar9 = &local_80;
        if ((ulong)uVar7 < (ulong)(local_88 + local_48)) {
          uVar7 = 0xf;
          if (local_90 != paVar9) {
            uVar7 = local_80._M_allocated_capacity;
          }
          if ((ulong)uVar7 < (ulong)(local_88 + local_48)) goto LAB_0017dec5;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
        }
        else {
LAB_0017dec5:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
        }
        local_70._M_dataplus._M_p = (pointer)*puVar4;
        psVar6 = puVar4 + 2;
        if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
          local_70.field_2._M_allocated_capacity = *psVar6;
          local_70.field_2._8_8_ = puVar4[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar6;
        }
        local_70._M_string_length = puVar4[1];
        *puVar4 = psVar6;
        puVar4[1] = 0;
        *(undefined1 *)psVar6 = 0;
        DeathTestAbort(&local_70);
        puVar4 = extraout_RAX;
        local_d0 = extraout_RDX;
        goto LAB_0017e0cb;
      }
      execv(**child_arg,*child_arg);
      paVar11 = &local_100;
      local_110 = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"execv(","");
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      paVar10 = &local_80;
      local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if (local_90 == paVar8) {
        local_80._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_80._8_8_ = puVar4[3];
        local_90 = paVar10;
      }
      else {
        local_80._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_88 = puVar4[1];
      *puVar4 = paVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      paVar8 = &local_a0;
      local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if (local_b0 == paVar9) {
        local_a0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_a0._8_8_ = puVar4[3];
        local_b0 = paVar8;
      }
      else {
        local_a0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_a8 = puVar4[1];
      *puVar4 = paVar9;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      paVar9 = &local_c0;
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      psVar6 = puVar4 + 2;
      if (local_d0 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_c0._M_allocated_capacity = *psVar6;
        local_c0._8_8_ = puVar4[3];
        local_d0 = paVar9;
      }
      else {
        local_c0._M_allocated_capacity = *psVar6;
      }
      local_c8 = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar3;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if (local_50 == paVar5) {
        local_40._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_40._8_8_ = plVar3[3];
        local_50 = &local_40;
      }
      else {
        local_40._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_48 = plVar3[1];
      *plVar3 = (long)paVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      GetLastErrnoDescription_abi_cxx11_();
      uVar7 = 0xf;
      if (local_50 != &local_40) {
        uVar7 = local_40._M_allocated_capacity;
      }
      if ((ulong)uVar7 < (ulong)(local_e8 + local_48)) {
        uVar7 = 0xf;
        if (local_f0 != &local_e0) {
          uVar7 = local_e0._M_allocated_capacity;
        }
        if ((ulong)uVar7 < (ulong)(local_e8 + local_48)) goto LAB_0017e086;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_0017e086:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0);
      }
      local_70._M_dataplus._M_p = (pointer)*puVar4;
      psVar6 = puVar4 + 2;
      if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = puVar4[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
      }
      local_70._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)psVar6 = 0;
      DeathTestAbort(&local_70);
      puVar4 = extraout_RAX_00;
      local_70._M_dataplus._M_p = (pointer)extraout_RDX_00;
      goto LAB_0017e1d2;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  paVar10 = &local_e0;
  local_f0 = paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  paVar11 = &local_100;
  local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if (local_110 == paVar8) {
    local_100._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_100._8_8_ = plVar3[3];
    local_110 = paVar11;
  }
  else {
    local_100._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)paVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  paVar8 = &local_80;
  local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar4;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if (local_90 == paVar9) {
    local_80._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_80._8_8_ = puVar4[3];
    local_90 = paVar8;
  }
  else {
    local_80._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_88 = puVar4[1];
  *puVar4 = paVar9;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_134 = 0x4d6;
  StreamableToString<int>(&local_130,&local_134);
  uVar7 = 0xf;
  if (local_90 != paVar8) {
    uVar7 = local_80._M_allocated_capacity;
  }
  paVar9 = &local_130.field_2;
  if ((ulong)uVar7 < local_130._M_string_length + local_88) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar9) {
      uVar7 = local_130.field_2._M_allocated_capacity;
    }
    if (local_130._M_string_length + local_88 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_90);
      goto LAB_0017df4b;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_130._M_dataplus._M_p);
LAB_0017df4b:
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar4;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if (local_b0 == paVar5) {
    local_a0._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_a0._8_8_ = puVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_a8 = puVar4[1];
  *puVar4 = paVar5;
  puVar4[1] = 0;
  paVar5->_M_local_buf[0] = '\0';
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
  local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar4;
  psVar6 = puVar4 + 2;
  if (local_d0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_c0._M_allocated_capacity = *psVar6;
    local_c0._8_8_ = puVar4[3];
    local_d0 = &local_c0;
  }
  else {
LAB_0017e0cb:
    local_c0._M_allocated_capacity = *psVar6;
  }
  local_c8 = puVar4[1];
  *puVar4 = psVar6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar4;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if (local_50 == paVar5) {
    local_40._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_40._8_8_ = puVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_48 = puVar4[1];
  *puVar4 = paVar5;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)*puVar4;
  psVar6 = puVar4 + 2;
  if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = puVar4[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
LAB_0017e1d2:
    local_70.field_2._M_allocated_capacity = *psVar6;
  }
  local_70._M_string_length = puVar4[1];
  *puVar4 = psVar6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  DeathTestAbort(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar9) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != paVar8) {
    operator_delete(local_90,local_80._M_allocated_capacity + 1);
  }
  if (local_110 != paVar11) {
    operator_delete(local_110,local_100._M_allocated_capacity + 1);
  }
  if (local_f0 != paVar10) {
    operator_delete(local_f0,local_e0._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}